

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

SortedVector *
wasm::ParamUtils::applyConstantValues
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module)

{
  pointer ppFVar1;
  Function *pFVar2;
  Function *pFVar3;
  long *plVar4;
  pointer ppCVar5;
  const_iterator __begin2;
  pointer ppFVar6;
  size_t sVar7;
  Expression **ppEVar8;
  Expression *value_00;
  LocalSet *left;
  Block *pBVar9;
  uint x;
  ulong index;
  long *plVar10;
  pointer ppCVar11;
  undefined1 local_80 [8];
  PossibleConstantValues value;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range3_1;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  Builder local_40;
  Builder builder;
  
  ppFVar6 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppFVar1 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  value.value.
  super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  ._24_8_ = calls;
  builder.wasm = (Module *)__return_storage_ptr__;
  if (ppFVar1 == ppFVar6) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                  ,0xd0,
                  "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                 );
  }
  pFVar2 = *ppFVar6;
  while (ppFVar6 != ppFVar1) {
    pFVar3 = *ppFVar6;
    ppFVar6 = ppFVar6 + 1;
    if ((pFVar3->type).id != (pFVar2->type).id) {
      __assert_fail("func->type == first->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0xd4,
                    "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                   );
    }
  }
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar7 = Function::getNumParams(pFVar2);
  x = 0;
  do {
    index = (ulong)x;
    if (sVar7 <= index) {
      return (SortedVector *)builder.wasm;
    }
    value.value.
    super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    ._M_u._16_1_ = 0;
    plVar4 = *(long **)(value.value.
                        super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        .
                        super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        .
                        super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        .
                        super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        .
                        super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        .
                        super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                        ._24_8_ + 8);
    for (plVar10 = *(long **)value.value.
                             super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             .
                             super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             .
                             super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             .
                             super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             .
                             super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             .
                             super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                             ._24_8_; plVar10 != plVar4; plVar10 = plVar10 + 1) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (*plVar10 + 0x10),index);
      PossibleConstantValues::note((PossibleConstantValues *)local_80,*ppEVar8,module);
      if ((value.value.
           super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           ._M_u._16_1_ == '\0') ||
         (value.value.
          super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          ._M_u._16_1_ == '\x03')) break;
    }
    ppCVar5 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar11 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar5;
        ppCVar11 = ppCVar11 + 1) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&((*ppCVar11)->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      PossibleConstantValues::note((PossibleConstantValues *)local_80,*ppEVar8,module);
      if ((value.value.
           super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           ._M_u._16_1_ == '\0') ||
         (value.value.
          super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          ._M_u._16_1_ == '\x03')) break;
    }
    if ((value.value.
         super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         .
         super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         .
         super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         .
         super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         .
         super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         .
         super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
         ._M_u._16_1_ != '\0') &&
       (value.value.
        super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        ._M_u._16_1_ != '\x03')) {
      ppFVar1 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      local_40.wasm = module;
      for (ppFVar6 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppFVar6 != ppFVar1;
          ppFVar6 = ppFVar6 + 1) {
        pFVar2 = *ppFVar6;
        value_00 = PossibleConstantValues::makeExpression((PossibleConstantValues *)local_80,module)
        ;
        left = Builder::makeLocalSet(&local_40,x,value_00);
        pBVar9 = Builder::makeSequence(&local_40,(Expression *)left,pFVar2->body);
        pFVar2->body = (Expression *)pBVar9;
      }
      SortedVector::insert((SortedVector *)builder.wasm,x);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                         *)local_80);
    x = x + 1;
  } while( true );
}

Assistant:

SortedVector applyConstantValues(const std::vector<Function*>& funcs,
                                 const std::vector<Call*>& calls,
                                 const std::vector<CallRef*>& callRefs,
                                 Module* module) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  SortedVector optimized;
  auto numParams = first->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    PossibleConstantValues value;
    for (auto* call : calls) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    for (auto* call : callRefs) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    if (!value.isConstant()) {
      continue;
    }

    // Optimize: write the constant value in the function bodies, making them
    // ignore the parameter's value.
    Builder builder(*module);
    for (auto* func : funcs) {
      func->body = builder.makeSequence(
        builder.makeLocalSet(i, value.makeExpression(*module)), func->body);
    }
    optimized.insert(i);
  }

  return optimized;
}